

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O3

bool __thiscall BmsHeaderTable::Query(BmsHeaderTable *this,string *key,int *v)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  const_iterator cVar3;
  BmsHeader *pBVar4;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
                  *)this,key);
  p_Var1 = &(this->table_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    pBVar4 = operator[](this,key);
    iVar2 = atoi((pBVar4->value)._M_dataplus._M_p);
    *v = iVar2;
  }
  return (_Rb_tree_header *)cVar3._M_node != p_Var1;
}

Assistant:

bool
BmsHeaderTable::Query(const std::string& key, int* v)
{
	if (IsExists(key)) {
		*v = this->operator[](key).ToInteger();
		return true;
	}
	return false;
}